

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O0

size_t __thiscall
CCharmapToLocal::map_utf8_alo(CCharmapToLocal *this,char **buf,char *src,size_t srclen)

{
  size_t sVar1;
  void *pvVar2;
  size_t *in_RCX;
  size_t in_RDX;
  long *in_RSI;
  size_t in_RDI;
  CCharmapToLocal *unaff_retaddr;
  size_t buflen;
  char *in_stack_fffffffffffffff8;
  
  sVar1 = map_utf8(unaff_retaddr,in_stack_fffffffffffffff8,in_RDI,(char *)in_RSI,in_RDX,in_RCX);
  pvVar2 = malloc(sVar1 + 1);
  *in_RSI = (long)pvVar2;
  if (in_RSI == (long *)0x0) {
    sVar1 = 0;
  }
  else {
    sVar1 = map_utf8(unaff_retaddr,in_stack_fffffffffffffff8,in_RDI,(char *)in_RSI,in_RDX,in_RCX);
    *(undefined1 *)(*in_RSI + sVar1) = 0;
  }
  return sVar1;
}

Assistant:

size_t CCharmapToLocal::map_utf8_alo(
    char **buf, const char *src, size_t srclen) const
{
    /* figure out how much space we need */
    size_t buflen = map_utf8(0, 0, src, srclen, 0);

    /* allocate the buffer, adding space for null termination */
    *buf = (char *)t3malloc(buflen + 1);
    
    /* if that failed, return null */
    if (buf == 0)
        return 0;

    /* do the mapping */
    buflen = map_utf8(*buf, buflen, src, srclen, 0);

    /* fill in the null terminator */
    (*buf)[buflen] = '\0';

    /* return the mapped length */
    return buflen;
}